

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execTasEa<(moira::Core)2,(moira::Instr)125,(moira::Mode)5,1>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint local_20;
  u32 local_1c;
  u32 data;
  u32 ea;
  int dst;
  u16 opcode_local;
  Moira *this_local;
  
  this->cp = 0;
  ea._2_2_ = opcode;
  _dst = this;
  (*this->_vptr_Moira[0xc])(this,"execTasEa",0x7d,5,1,(ulong)opcode);
  data = ea._2_2_ & 7;
  readOp<(moira::Core)2,(moira::Mode)5,1,0ull>(this,data,&local_1c,&local_20);
  bVar1 = NBIT<1>((ulong)local_20);
  (this->reg).sr.n = bVar1;
  bVar1 = ZERO<1>((ulong)local_20);
  (this->reg).sr.z = bVar1;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  local_20 = local_20 | 0x80;
  writeOp<(moira::Core)2,(moira::Mode)5,1,0ull>(this,data,local_1c,local_20);
  prefetch<(moira::Core)2,4ull>(this);
  return;
}

Assistant:

void
Moira::execTasEa(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int dst = ( _____________xxx(opcode) );

    u32 ea, data;

    if (C == Core::C68000) {

        readOp<C, M, Byte>(dst, &ea, &data);

        reg.sr.n = NBIT<Byte>(data);
        reg.sr.z = ZERO<Byte>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
        data |= 0x80;

        if (!isRegMode(M)) SYNC(2);
        writeOp<C, M, S>(dst, ea, data);

        prefetch<C, POLL>();

    } else {

        if constexpr (M == Mode::AI) SYNC(2);
        if constexpr (M == Mode::PI) SYNC(4);
        if constexpr (M == Mode::PD) SYNC(2);
        if constexpr (M == Mode::IX) SYNC(2);

        readOp<C, M, Byte>(dst, &ea, &data);

        reg.sr.n = NBIT<Byte>(data);
        reg.sr.z = ZERO<Byte>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
        data |= 0x80;

        // if (!isRegMode(M)) SYNC(2);
        writeOp<C, M, S>(dst, ea, data);

        prefetch<C, POLL>();
        SYNC(2);
    }

    FINALIZE
}